

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void trace_start(jit_State *J)

{
  uint8_t *puVar1;
  IRIns *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  TraceNo TVar6;
  undefined4 uVar7;
  lua_State *L;
  TValue *pTVar8;
  SnapShot *pSVar9;
  IRIns *pIVar10;
  bool bVar11;
  int32_t iVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  IRRef1 IVar16;
  IRRef1 IVar17;
  uint uVar18;
  uint uVar19;
  TRef TVar20;
  TRef TVar21;
  GCRef *pGVar22;
  ptrdiff_t argbase;
  GCstr *pGVar23;
  long lVar24;
  ulong uVar25;
  GCproto *pGVar26;
  IROpT IVar27;
  uint uVar28;
  ulong uVar29;
  IRIns *pIVar30;
  IRIns *pIVar31;
  IRIns *pIVar32;
  IRIns *pIVar33;
  char cVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  GCtrace *T;
  SnapEntry *pSVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  ulong local_88;
  
  if ((J->pt->flags & 8) != 0) {
    if (J->parent == 0) {
      *(char *)J->pc = (char)*J->pc + '\x01';
      puVar1 = &J->pt->flags;
      *puVar1 = *puVar1 | 0x10;
    }
LAB_001210ee:
    J->state = LJ_TRACE_IDLE;
    return;
  }
  if (J->freetrace == 0) {
    J->freetrace = 1;
  }
  uVar36 = (ulong)J->freetrace;
  uVar28 = J->sizetrace;
  if (J->freetrace < uVar28) {
    do {
      if (J->trace[uVar36].gcptr32 == 0) {
        J->freetrace = (int)uVar36 + 1;
        goto LAB_00121107;
      }
      uVar36 = uVar36 + 1;
      J->freetrace = (TraceNo)uVar36;
    } while (uVar28 != uVar36);
  }
  uVar18 = J->param[0] + 1;
  if (0xfffe < uVar18) {
    uVar18 = 0xffff;
  }
  uVar35 = 2;
  if (2 < uVar18) {
    uVar35 = uVar18;
  }
  uVar36 = 0;
  if (uVar28 < uVar35) {
    uVar18 = 8;
    if (8 < uVar28 * 2) {
      uVar18 = uVar28 * 2;
    }
    if (uVar18 < uVar35) {
      uVar35 = uVar18;
    }
    pGVar22 = (GCRef *)lj_mem_realloc(J->L,J->trace,uVar28 * 4,uVar35 * 4);
    J->sizetrace = uVar35;
    J->trace = pGVar22;
    if (uVar28 < uVar18) {
      uVar18 = uVar28 + 1;
      if (uVar28 + 1 < uVar35) {
        uVar18 = uVar35;
      }
      memset(pGVar22 + uVar28,0,(ulong)(~uVar28 + uVar18) * 4 + 4);
    }
    uVar36 = (ulong)J->freetrace;
  }
LAB_00121107:
  if ((int)uVar36 == 0) {
    lj_trace_flushall(J->L);
    goto LAB_001210ee;
  }
  J->trace[uVar36 & 0xffffffff].gcptr32 = (uint32_t)J;
  (J->cur).traceno = 0;
  (J->cur).link = 0;
  (J->cur).root = 0;
  (J->cur).nextroot = 0;
  (J->cur).nextside = 0;
  (J->cur).sinktags = '\0';
  (J->cur).unused1 = '\0';
  *(undefined4 *)&(J->cur).field_0x5c = 0;
  (J->cur).ir = (IRIns *)0x0;
  (J->cur).nk = 0;
  (J->cur).nsnap = 0;
  (J->cur).nsnapmap = 0;
  (J->cur).nextgc = 0;
  (J->cur).marked = '\0';
  (J->cur).gct = '\0';
  (J->cur).topslot = '\0';
  (J->cur).linktype = '\0';
  (J->cur).nins = 0;
  (J->cur).gclist = 0;
  (J->cur).startpt = 0;
  (J->cur).startpc = 0;
  (J->cur).startins = 0;
  (J->cur).szmcode = 0;
  (J->cur).mcode = (MCode *)0x0;
  (J->cur).mcloop = 0;
  (J->cur).nchild = 0;
  (J->cur).spadjust = 0;
  (J->cur).traceno = (TraceNo1)uVar36;
  (J->cur).nk = 0x8000;
  (J->cur).nins = 0x8000;
  (J->cur).ir = J->irbuf;
  pSVar38 = J->snapmapbuf;
  (J->cur).snap = J->snapbuf;
  (J->cur).snapmap = pSVar38;
  cVar34 = '\0';
  J->postproc = LJ_POST_NONE;
  J->mergesnap = '\0';
  J->needsnap = '\0';
  J->guardemit = '\0';
  J->bcskip = '\0';
  (J->cur).startpt.gcptr32 = *(uint32_t *)&J->pt;
  L = J->L;
  if (((*(byte *)((ulong)(L->glref).ptr32 + 0x93) & 2) != 0) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE), argbase != 0)) {
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    pGVar23 = lj_str_new(L,"start",5);
    (pTVar8->u32).lo = (uint32_t)pGVar23;
    (pTVar8->field_2).it = 0xfffffffb;
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    pTVar8->n = (double)(int)uVar36;
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    (pTVar8->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)&J->fn;
    (pTVar8->field_2).it = 0xfffffff7;
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    pTVar8->n = (double)(int)((ulong)((long)J->pc + (-0x40 - (long)J->pt)) >> 2);
    TVar6 = J->parent;
    if (TVar6 != 0) {
      pTVar8 = L->top;
      L->top = pTVar8 + 1;
      pTVar8->n = (double)(int)TVar6;
      pTVar8 = L->top;
      L->top = pTVar8 + 1;
      pTVar8->n = (double)(int)J->exitno;
    }
    lj_vmevent_call(L,argbase);
  }
  J->bpropcache[0xe].key = 0;
  J->bpropcache[0xe].val = 0;
  J->bpropcache[0xe].mode = 0;
  J->bpropcache[0xf].key = 0;
  J->bpropcache[0xf].val = 0;
  J->bpropcache[0xf].mode = 0;
  J->bpropcache[0xc].key = 0;
  J->bpropcache[0xc].val = 0;
  J->bpropcache[0xc].mode = 0;
  J->bpropcache[0xd].key = 0;
  J->bpropcache[0xd].val = 0;
  J->bpropcache[0xd].mode = 0;
  J->bpropcache[10].key = 0;
  J->bpropcache[10].val = 0;
  J->bpropcache[10].mode = 0;
  J->bpropcache[0xb].key = 0;
  J->bpropcache[0xb].val = 0;
  J->bpropcache[0xb].mode = 0;
  J->bpropcache[8].key = 0;
  J->bpropcache[8].val = 0;
  J->bpropcache[8].mode = 0;
  J->bpropcache[9].key = 0;
  J->bpropcache[9].val = 0;
  J->bpropcache[9].mode = 0;
  J->bpropcache[6].key = 0;
  J->bpropcache[6].val = 0;
  J->bpropcache[6].mode = 0;
  J->bpropcache[7].key = 0;
  J->bpropcache[7].val = 0;
  J->bpropcache[7].mode = 0;
  J->bpropcache[4].key = 0;
  J->bpropcache[4].val = 0;
  J->bpropcache[4].mode = 0;
  J->bpropcache[5].key = 0;
  J->bpropcache[5].val = 0;
  J->bpropcache[5].mode = 0;
  J->bpropcache[2].key = 0;
  J->bpropcache[2].val = 0;
  J->bpropcache[2].mode = 0;
  J->bpropcache[3].key = 0;
  J->bpropcache[3].val = 0;
  J->bpropcache[3].mode = 0;
  J->bpropcache[0].key = 0;
  J->bpropcache[0].val = 0;
  J->bpropcache[0].mode = 0;
  J->bpropcache[1].key = 0;
  J->bpropcache[1].val = 0;
  J->bpropcache[1].mode = 0;
  memset(J->chain,0,0x4b8);
  (J->scev).idx = 0x7fff;
  (J->scev).pc.ptr32 = 0;
  J->base = J->slot + 1;
  J->maxslot = 0;
  J->baseslot = 1;
  J->retdepth = 0;
  iVar12 = J->param[9];
  J->instunroll = J->param[8];
  J->loopunroll = iVar12;
  J->tailcalled = 0;
  J->framedepth = 0;
  J->loopref = 0;
  J->bc_min = (BCIns *)0x0;
  J->bc_extent = 0xffffffff;
  (J->fold).ins.field_0.ot = 0xd05;
  uVar3 = J->parent;
  uVar4 = J->exitno;
  auVar40._4_4_ = uVar4;
  auVar40._0_4_ = uVar3;
  auVar40._8_8_ = 0;
  auVar40 = pshuflw(auVar40,auVar40,0xe8);
  (J->fold).ins.field_1.op12 = auVar40._0_4_;
  lj_ir_emit(J);
  lVar24 = 0;
  do {
    pIVar33 = (J->cur).ir;
    pIVar33[lVar24 + 0x7fff].field_1.op12 = 0;
    *(char *)((long)pIVar33 + lVar24 * 8 + 0x3fffc) = cVar34;
    *(undefined1 *)((long)pIVar33 + lVar24 * 8 + 0x3fffd) = 0x15;
    *(undefined2 *)((long)pIVar33 + lVar24 * 8 + 0x3fffe) = 0;
    lVar24 = lVar24 + -1;
    cVar34 = cVar34 + '\x01';
  } while (lVar24 != -3);
  (J->cur).nk = 0x7ffd;
  pGVar26 = (GCproto *)J->pc;
  J->startpc = (BCIns *)pGVar26;
  (J->cur).startpc.ptr32 = (uint32_t)pGVar26;
  uVar28 = J->parent;
  if ((ulong)uVar28 != 0) {
    T = (GCtrace *)(ulong)J->trace[uVar28].gcptr32;
    if (T->root != 0) {
      uVar28 = (uint)T->root;
    }
    (J->cur).root = (TraceNo1)uVar28;
    (J->cur).startins = 0x54;
    uVar36 = (ulong)J->exitno;
    if ((uVar36 == 0) && (T->snap->nent == '\0')) {
      if (((J->pt + 1 < pGVar26) && (uVar18 = pGVar26[-1].varinfo.ptr32, (char)uVar18 == 'J')) &&
         (*(ushort *)((long)pGVar26 + (ulong)(uVar18 >> 0x10) * 4 + -0x20002) == uVar28)) {
        lj_snap_add(J);
        rec_for_loop(J,J->pc + -1,&J->scev,1);
        goto LAB_00121b8e;
      }
    }
    else {
      J->startpc = (BCIns *)0x0;
    }
    pSVar9 = T->snap;
    pSVar38 = T->snapmap + pSVar9[uVar36].mapofs;
    bVar5 = pSVar9[uVar36].nent;
    uVar25 = (ulong)bVar5;
    J->framedepth = 0;
    if (bVar5 == 0) {
      bVar11 = true;
      local_88 = 0;
    }
    else {
      bVar11 = false;
      uVar37 = 0;
      local_88 = 0;
      do {
        uVar28 = pSVar38[uVar37];
        uVar35 = uVar28 >> 0x18;
        uVar18 = uVar28 & 0xffff;
        pIVar33 = (IRIns *)((ulong)(uVar18 * 8) + (long)T->ir);
        if ((local_88 >> ((ulong)uVar28 & 0x3f) & 1) == 0) {
LAB_001214a6:
          local_88 = local_88 | 1L << ((byte)uVar28 & 0x3f);
          if (uVar18 < 0x8000) {
            uVar19 = snap_replay_const(J,pIVar33);
          }
          else if (((pIVar33->field_0).prev & 0xff80) == 0x80) {
            bVar11 = true;
            uVar19 = uVar35;
          }
          else {
            uVar13 = 0x21;
            if ((pIVar33->field_1).o == 'E') {
              uVar13 = (pIVar33->field_0).op2 & 0x10 | 0x21;
            }
            (J->fold).ins.field_0.ot = (pIVar33->field_1).t.irt & 0x1f | 0x4500;
            *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar28 >> 0x18);
            (J->fold).ins.field_0.op2 = uVar13;
            uVar19 = lj_ir_emit(J);
          }
        }
        else {
          uVar19 = 0;
          if (uVar37 != 0) {
            uVar29 = 0;
            do {
              if ((pSVar38[uVar29] & 0xffff) == uVar18) {
                uVar19 = J->slot[pSVar38[uVar29] >> 0x18] & 0xfffcffff;
                break;
              }
              uVar29 = uVar29 + 1;
              uVar19 = 0;
            } while (uVar37 != uVar29);
          }
          if (uVar19 == 0) goto LAB_001214a6;
        }
        J->slot[uVar35] = uVar19 | uVar28 & 0x30000;
        J->framedepth = J->framedepth + (uint)(0xffffff < uVar28 && (uVar28 & 0x30000) != 0);
        if ((uVar28 >> 0x10 & 1) != 0) {
          J->baseslot = uVar35 + 1;
        }
        uVar37 = uVar37 + 1;
      } while (uVar37 != uVar25);
      bVar11 = !bVar11;
    }
    if (bVar11) {
      J->base = J->slot + J->baseslot;
      J->maxslot = (uint)pSVar9[uVar36].nslots - J->baseslot;
      lj_snap_add(J);
    }
    else {
      uVar13 = pSVar9[uVar36].ref;
      pIVar33 = T->ir;
      uVar28 = (uint)bVar5;
      if (uVar25 == 0) {
        bVar11 = false;
      }
      else {
        uVar37 = 0;
        bVar11 = false;
        do {
          uVar18 = pSVar38[uVar37];
          pIVar2 = T->ir + (uVar18 & 0xffff);
          if ((pIVar2->field_1).r == 0xfd) {
            if (J->slot[uVar18 >> 0x18] == uVar18 >> 0x18) {
              if (T->nk <= (uint)(pIVar2->field_0).op1) {
                snap_pref(J,T,pSVar38,uVar28,local_88,(uint)(pIVar2->field_0).op1);
              }
              if (T->nk <= (uint)(pIVar2->field_0).op2) {
                snap_pref(J,T,pSVar38,uVar28,local_88,(uint)(pIVar2->field_0).op2);
              }
              bVar11 = true;
              pIVar32 = pIVar2;
              if ((pIVar2->field_1).o != 'Q') {
LAB_001216cd:
                pIVar31 = pIVar32;
                pIVar32 = pIVar31 + 1;
                if (pIVar32 < pIVar33 + uVar13) {
                  if (*(char *)((long)pIVar31 + 0xe) == -2) {
                    if ((ulong)*(byte *)((long)pIVar31 + 0xf) == 0xff) {
                      uVar18 = *(byte *)((long)pIVar31 + 0xd) - 0x47;
                      if ((4 < uVar18) || (uVar18 == 2)) goto LAB_001216cd;
                      pIVar10 = T->ir;
                      pIVar30 = pIVar10 + (pIVar32->field_0).op1;
                      if (((pIVar30->field_1).o & 0xfe) == 0x38) {
                        pIVar30 = pIVar10 + (pIVar30->field_0).op1;
                      }
                      bVar39 = pIVar10 + (pIVar30->field_0).op1 == pIVar2;
                    }
                    else {
                      bVar39 = pIVar32 == pIVar2 + *(byte *)((long)pIVar31 + 0xf);
                    }
                    if ((bVar39) &&
                       (TVar20 = snap_pref(J,T,pSVar38,uVar28,local_88,
                                           (uint)*(ushort *)((long)pIVar31 + 10)), TVar20 == 0)) {
                      snap_pref(J,T,pSVar38,uVar28,local_88,
                                (uint)T->ir[*(ushort *)((long)pIVar31 + 10)].field_0.op1);
                    }
                  }
                  goto LAB_001216cd;
                }
              }
            }
          }
          else if ((0x7fff < (uVar18 & 0xffff)) && (((pIVar2->field_0).prev & 0xff80) == 0x80)) {
            TVar20 = snap_pref(J,T,pSVar38,uVar28,local_88,(uint)(pIVar2->field_0).op1);
            J->slot[uVar18 >> 0x18] = TVar20;
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar25);
      }
      if (uVar25 != 0 && bVar11) {
        uVar37 = 0;
        do {
          uVar29 = (ulong)(pSVar38[uVar37] & 0xffff);
          if (*(char *)((long)T->ir + uVar29 * 8 + 6) == -3) {
            uVar18 = pSVar38[uVar37] >> 0x18;
            if (J->slot[uVar18] == uVar18) {
              pIVar2 = T->ir + uVar29;
              uVar14 = (pIVar2->field_0).op1;
              if (T->nk <= (uint)uVar14) {
                TVar20 = snap_pref(J,T,pSVar38,uVar28,local_88,(uint)uVar14);
                uVar14 = (ushort)TVar20;
              }
              uVar15 = (pIVar2->field_0).op2;
              if (T->nk <= (uint)uVar15) {
                TVar20 = snap_pref(J,T,pSVar38,uVar28,local_88,(uint)uVar15);
                uVar15 = (ushort)TVar20;
              }
              if ((pIVar2->field_1).o != 'Q') {
                (J->fold).ins.field_0.ot = (pIVar2->field_0).ot;
                (J->fold).ins.field_0.op1 = uVar14;
                (J->fold).ins.field_0.op2 = uVar15;
                TVar20 = lj_opt_fold(J);
                J->slot[uVar18] = TVar20;
                pIVar32 = pIVar2;
joined_r0x0012193b:
                pIVar32 = pIVar32 + 1;
                if (pIVar32 < pIVar33 + uVar13) {
                  if ((pIVar32->field_1).r != 0xfe) goto LAB_001219c0;
                  if ((ulong)(pIVar32->field_1).s == 0xff) {
                    uVar18 = (pIVar32->field_1).o - 0x47;
                    if ((4 < uVar18) || (uVar18 == 2)) goto LAB_001219c0;
                    pIVar30 = T->ir;
                    pIVar31 = pIVar30 + (pIVar32->field_0).op1;
                    if (((pIVar31->field_1).o & 0xfe) == 0x38) {
                      pIVar31 = pIVar30 + (pIVar31->field_0).op1;
                    }
                    bVar39 = pIVar30 + (pIVar31->field_0).op1 == pIVar2;
                  }
                  else {
                    bVar39 = pIVar32 == pIVar2 + (pIVar32->field_1).s;
                  }
                  if (!bVar39) goto LAB_001219c0;
                  pIVar31 = T->ir;
                  uVar29 = (ulong)(pIVar32->field_0).op1;
                  uVar14 = *(ushort *)((long)pIVar31 + uVar29 * 8 + 2);
                  cVar34 = *(char *)((long)pIVar31 + uVar29 * 8 + 5);
                  IVar16 = (IRRef1)TVar20;
                  if (cVar34 != '>') {
                    pIVar30 = pIVar31 + uVar14;
                    if (cVar34 == '9') {
                      TVar21 = snap_replay_const(J,pIVar31 + (pIVar30->field_0).op1);
                      TVar21 = lj_ir_kslot(J,TVar21,(uint)(pIVar30->field_0).op2);
                      uVar14 = (ushort)TVar21;
                    }
                    else {
                      TVar21 = snap_replay_const(J,pIVar30);
                      uVar14 = (ushort)TVar21;
                    }
                    if ((*(byte *)((long)pIVar31 + uVar29 * 8 + 5) & 0xfe) == 0x38) {
                      uVar7 = *(undefined4 *)
                               ((long)T->ir + (ulong)pIVar31[uVar29].field_0.op1 * 8 + 2);
                      (J->fold).ins.field_0.op1 = IVar16;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar7;
                      TVar21 = lj_opt_fold(J);
                      IVar16 = (IRRef1)TVar21;
                    }
                  }
                  (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar31 + uVar29 * 8 + 4);
                  (J->fold).ins.field_0.op1 = IVar16;
                  (J->fold).ins.field_0.op2 = uVar14;
                  TVar21 = lj_opt_fold(J);
                  IVar16 = (IRRef1)TVar21;
                  TVar21 = snap_pref(J,T,pSVar38,uVar28,local_88,(uint)(pIVar32->field_0).op2);
                  if (TVar21 == 0) {
                    TVar21 = snap_pref(J,T,pSVar38,uVar28,local_88,
                                       (uint)T->ir[(pIVar32->field_0).op2].field_0.op1);
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar21;
                    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
                    TVar21 = lj_opt_fold(J);
                  }
                  IVar17 = (IRRef1)TVar21;
                  IVar27 = (pIVar32->field_0).ot;
                  goto LAB_00121af7;
                }
                goto LAB_001218e9;
              }
              (J->fold).ins.field_0.ot = (pIVar2->field_0).ot & 0xff9f;
              (J->fold).ins.field_0.op1 = uVar14;
              (J->fold).ins.field_0.op2 = uVar15;
              TVar20 = lj_opt_fold(J);
            }
            else {
              TVar20 = J->slot[J->slot[uVar18]];
            }
            J->slot[uVar18] = TVar20;
          }
LAB_001218e9:
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar25);
      }
      J->base = J->slot + J->baseslot;
      J->maxslot = (uint)pSVar9[uVar36].nslots - J->baseslot;
      lj_snap_add(J);
      if (bVar11) {
        (J->fold).ins.field_0.ot = 0xf80;
        (J->fold).ins.field_1.op12 = 0;
        lj_ir_emit(J);
      }
    }
LAB_00121b8e:
    if (((int)(uint)*(ushort *)((ulong)J->trace[(J->cur).root].gcptr32 + 0x4c) < J->param[3]) &&
       ((int)(uint)T->snap[J->exitno].count < J->param[7] + J->param[6])) {
      return;
    }
    rec_stop(J,LJ_TRLINK_INTERP,0);
    return;
  }
  (J->cur).root = 0;
  (J->cur).startins = (pGVar26->nextgc).gcptr32;
  uVar28 = (pGVar26->nextgc).gcptr32;
  if (0xf < (uVar28 & 0xff) - 0x46) goto switchD_001215b5_caseD_49;
  uVar18 = uVar28 >> 8 & 0xff;
  switch(uVar28 & 0xff) {
  case 0x46:
  case 0x47:
  case 0x48:
    J->maxslot = ((uVar28 >> 0x10) + uVar18) - 1;
    break;
  case 0x4e:
    J->maxslot = (uVar18 + *(byte *)((long)&pGVar26[-1].varinfo.ptr32 + 3)) - 1;
  case 0x4b:
    uVar28 = uVar28 >> 0xe & 0xfffffffc;
    J->bc_extent = 0x20000 - uVar28;
    pGVar26 = (GCproto *)((long)pGVar26 + ((ulong)uVar28 - 0x1fffc));
    J->bc_min = (BCIns *)pGVar26;
    break;
  case 0x51:
    uVar35 = (&pGVar26[-0x800].nextgc)[uVar28 >> 0x10].gcptr32;
    if ((uVar35 & 0x800000ff) == 0x54) {
      uVar35 = uVar35 >> 0xe & 0xfffffffc;
      J->bc_min = (BCIns *)((long)pGVar26 + (ulong)uVar35 + (ulong)(uVar28 >> 0x10) * 4 + -0x3fffc);
      J->bc_extent = 0x20000 - uVar35;
    }
    J->maxslot = uVar18;
    goto LAB_00121c92;
  case 0x55:
    J->maxslot = (uint)J->pt->numparams;
LAB_00121c92:
    pGVar26 = (GCproto *)&pGVar26->marked;
  }
switchD_001215b5_caseD_49:
  J->pc = (BCIns *)pGVar26;
  lj_snap_add(J);
  if ((char)(J->cur).startins == 'K') {
    rec_for_loop(J,J->pc + -1,&J->scev,1);
  }
  if (J->pt->framesize < 0xf9) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
LAB_001219c0:
  if (((pIVar32->field_1).o == 'T') && ((pIVar2->field_1).o == 'P')) {
    IVar27 = 0x5400;
    IVar16 = 0;
    IVar17 = 0;
LAB_00121af7:
    (J->fold).ins.field_0.ot = IVar27;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar17;
    lj_opt_fold(J);
  }
  goto joined_r0x0012193b;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lua_assert(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF);
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lua_assert((J2G(J)->hookmask & HOOK_GC) == 0);
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    }
  );
  lj_record_setup(J);
}